

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O0

void prngEchoStepR(void *buf,size_t count,void *state)

{
  size_t sVar1;
  prng_echo_st *s;
  void *state_local;
  size_t count_local;
  void *buf_local;
  
  count_local = count;
  buf_local = buf;
  while (sVar1 = count_local - 1, count_local != 0) {
    *(undefined1 *)buf_local = *(undefined1 *)(*state + *(long *)((long)state + 0x10));
    buf_local = (void *)((long)buf_local + 1);
    *(long *)((long)state + 0x10) = *(long *)((long)state + 0x10) + 1;
    count_local = sVar1;
    if (*(long *)((long)state + 0x10) == *(long *)((long)state + 8)) {
      *(undefined8 *)((long)state + 0x10) = 0;
    }
  }
  return;
}

Assistant:

void prngEchoStepR(void* buf, size_t count, void* state)
{
	prng_echo_st* s = (prng_echo_st*)state;
	ASSERT(memIsValid(s, sizeof(prng_echo_st)));
	ASSERT(memIsValid(s->seed, s->seed_len));
	ASSERT(memIsValid(buf, count));
	// генерировать
	while (count--)
	{
		*((octet*)buf) = s->seed[s->pos];
		buf = (octet*)buf + 1;
		++s->pos;
		if (s->pos == s->seed_len)
			s->pos = 0;
	}
}